

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::ClearEmissionSystem(Electromagnetic_Emission_PDU *this)

{
  Electromagnetic_Emission_PDU *this_local;
  
  std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
  clear(&this->m_vEmissionSystem);
  this->m_ui8NumberOfEmissionSystems = '\0';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x1c;
  return;
}

Assistant:

void Electromagnetic_Emission_PDU::ClearEmissionSystem()
{
    m_vEmissionSystem.clear();
    m_ui8NumberOfEmissionSystems = 0;
    m_ui16PDULength = ELECTROMAGNETIC_EMISSION_PDU_SIZE;
}